

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprog.c
# Opt level: O2

bool aggress_prog_arangird_regthor(CHAR_DATA *mob,CHAR_DATA *attacker)

{
  CHAR_DATA *ch;
  
  ch = get_char_room(mob,"ertruza");
  if (ch != (CHAR_DATA *)0x0) {
    act("A look of horror crosses $n\'s face as $s concentration falters.",mob,(void *)0x0,ch,4);
    act("The barrier surrounding $N flickers and fades, and $n shrieks!",mob,(void *)0x0,ch,4);
    act("Roaring with anger, $n grabs his former captor and devours $M whole!",ch,(void *)0x0,mob,4)
    ;
    extract_char(mob,true);
    act("$n then turns you and strikes!",ch,(void *)0x0,attacker,3);
    act("$n then turns to $N and strikes!",ch,(void *)0x0,attacker,0);
    do_murder(ch,attacker->name);
  }
  return ch != (CHAR_DATA *)0x0;
}

Assistant:

bool aggress_prog_arangird_regthor(CHAR_DATA *mob, CHAR_DATA *attacker)
{
	CHAR_DATA *demon;

	if ((demon = get_char_room(mob, "ertruza")) == nullptr)
		return false;

	act("A look of horror crosses $n's face as $s concentration falters.", mob, 0, demon, TO_ALL);
	act("The barrier surrounding $N flickers and fades, and $n shrieks!", mob, 0, demon, TO_ALL);
	act("Roaring with anger, $n grabs his former captor and devours $M whole!", demon, 0, mob, TO_ALL);

	extract_char(mob, true);

	act("$n then turns you and strikes!", demon, 0, attacker, TO_CHAR);
	act("$n then turns to $N and strikes!", demon, 0, attacker, TO_ROOM);
	do_murder(demon, attacker->name);

	return true;
}